

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

void SUNMatDestroy_Band(SUNMatrix A)

{
  void *pvVar1;
  
  if (A != (SUNMatrix)0x0) {
    if (A->content != (void *)0x0) {
      pvVar1 = *(void **)((long)A->content + 0x18);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)A->content + 0x18) = 0;
      }
      pvVar1 = *(void **)((long)A->content + 0x28);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)A->content + 0x28) = 0;
      }
      free(A->content);
      A->content = (void *)0x0;
    }
    if (A->ops != (SUNMatrix_Ops)0x0) {
      free(A->ops);
      A->ops = (SUNMatrix_Ops)0x0;
    }
    free(A);
    return;
  }
  return;
}

Assistant:

void SUNMatDestroy_Band(SUNMatrix A)
{
  if (A == NULL) return;

  /* free content */
  if (A->content != NULL) {
    /* free data array */
    if (SM_DATA_B(A)) {
      free(SM_DATA_B(A));
      SM_DATA_B(A) = NULL;
    }
    /* free column pointers */
    if (SM_COLS_B(A)) {
      free(SM_COLS_B(A));
      SM_COLS_B(A) = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops) { free(A->ops); A->ops = NULL; }
  free(A); A = NULL;

  return;
}